

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  void *__src;
  long lVar9;
  byte bVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uchar *puVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  size_t sVar20;
  int iVar21;
  uint uVar22;
  uchar *puVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  int data_len;
  int zlen;
  int local_d8;
  int local_3c;
  uchar *local_38;
  
  uVar27 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar27;
  }
  data_len = (uVar27 + 1) * y;
  puVar8 = (uchar *)malloc((long)data_len);
  if (puVar8 != (uchar *)0x0) {
    sVar20 = (size_t)(int)uVar27;
    __src = malloc(sVar20);
    if (__src == (void *)0x0) {
      free(puVar8);
    }
    else {
      lVar9 = (long)n;
      if (0 < y) {
        lVar11 = (long)stride_bytes;
        lVar18 = (long)pixels - lVar11;
        puVar23 = pixels + lVar9;
        puVar16 = pixels + (lVar9 - lVar11);
        uVar14 = 0;
        do {
          piVar12 = stbi_write_png_to_mem::mapping;
          if (uVar14 == 0) {
            piVar12 = stbi_write_png_to_mem::firstmap;
          }
          iVar24 = 0x7fffffff;
          iVar7 = 0;
          bVar4 = true;
          do {
            bVar3 = bVar4;
            iVar6 = iVar7;
            if (bVar3) {
              iVar6 = 0;
            }
            local_d8 = iVar7;
            if (iVar6 < 5) {
              lVar13 = (long)iVar6;
              do {
                iVar6 = piVar12[lVar13];
                if (0 < n) {
                  uVar25 = 0;
                  do {
                    switch(iVar6) {
                    case 0:
                    case 1:
                    case 5:
                    case 6:
                      uVar5 = pixels[uVar25];
                      break;
                    case 2:
                    case 4:
                      uVar5 = pixels[uVar25] - *(char *)(lVar18 + uVar25);
                      break;
                    case 3:
                      uVar5 = pixels[uVar25] - (*(byte *)(lVar18 + uVar25) >> 1);
                      break;
                    default:
                      goto switchD_001130b2_default;
                    }
                    *(uchar *)((long)__src + uVar25) = uVar5;
switchD_001130b2_default:
                    uVar25 = uVar25 + 1;
                  } while ((uint)n != uVar25);
                }
                if (n < (int)uVar27) {
                  lVar26 = 0;
                  do {
                    switch(iVar6) {
                    case 0:
                      uVar5 = puVar23[lVar26];
                      break;
                    case 1:
                    case 6:
                      uVar5 = puVar23[lVar26] - pixels[lVar26];
                      break;
                    case 2:
                      uVar5 = puVar23[lVar26] - puVar16[lVar26];
                      break;
                    case 3:
                      uVar5 = puVar23[lVar26] -
                              (char)((uint)puVar16[lVar26] + (uint)pixels[lVar26] >> 1);
                      break;
                    case 4:
                      bVar19 = pixels[lVar26];
                      bVar1 = puVar16[lVar26];
                      bVar10 = *(byte *)(lVar18 + lVar26);
                      iVar21 = ((uint)bVar1 + (uint)bVar19) - (uint)bVar10;
                      uVar15 = iVar21 - (uint)bVar19;
                      uVar2 = -uVar15;
                      if (0 < (int)uVar15) {
                        uVar2 = uVar15;
                      }
                      uVar17 = iVar21 - (uint)bVar1;
                      uVar15 = -uVar17;
                      if (0 < (int)uVar17) {
                        uVar15 = uVar17;
                      }
                      uVar22 = iVar21 - (uint)bVar10;
                      uVar17 = -uVar22;
                      if (0 < (int)uVar22) {
                        uVar17 = uVar22;
                      }
                      if (uVar15 <= uVar17) {
                        bVar10 = bVar1;
                      }
                      if (uVar17 < uVar2) {
                        bVar19 = bVar10;
                      }
                      if (uVar15 < uVar2) {
                        bVar19 = bVar10;
                      }
                      uVar5 = puVar23[lVar26] - bVar19;
                      break;
                    case 5:
                      uVar5 = puVar23[lVar26] - (pixels[lVar26] >> 1);
                      break;
                    default:
                      goto switchD_00113104_default;
                    }
                    *(uchar *)((long)__src + lVar26 + lVar9) = uVar5;
switchD_00113104_default:
                    lVar26 = lVar26 + 1;
                  } while (sVar20 - lVar9 != lVar26);
                }
                if (!bVar3) goto LAB_00113285;
                if ((int)uVar27 < 1) {
                  iVar6 = 0;
                }
                else {
                  uVar25 = 0;
                  iVar6 = 0;
                  do {
                    bVar19 = (char)*(byte *)((long)__src + uVar25) >> 7;
                    iVar6 = iVar6 + (uint)(byte)((*(byte *)((long)__src + uVar25) ^ bVar19) - bVar19
                                                );
                    uVar25 = uVar25 + 1;
                  } while (uVar27 != uVar25);
                }
                if (iVar6 < iVar24) {
                  local_d8 = (int)lVar13;
                  iVar24 = iVar6;
                }
                lVar13 = lVar13 + 1;
              } while ((int)lVar13 != 5);
            }
            iVar7 = local_d8;
            bVar4 = false;
          } while (bVar3);
LAB_00113285:
          lVar13 = uVar14 * (long)(int)(uVar27 + 1);
          puVar8[lVar13] = (uchar)iVar7;
          memcpy(puVar8 + lVar13 + 1,__src,sVar20);
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + lVar11;
          pixels = pixels + lVar11;
          puVar23 = puVar23 + lVar11;
          puVar16 = puVar16 + lVar11;
        } while (uVar14 != (uint)y);
      }
      free(__src);
      puVar23 = stbi_zlib_compress(puVar8,data_len,&local_3c,8);
      free(puVar8);
      sVar20 = (size_t)local_3c;
      puVar8 = (uchar *)malloc(sVar20 + 0x39);
      if (puVar8 != (uchar *)0x0) {
        *out_len = (int)(sVar20 + 0x39);
        puVar8[0] = 0x89;
        puVar8[1] = 'P';
        puVar8[2] = 'N';
        puVar8[3] = 'G';
        puVar8[4] = '\r';
        puVar8[5] = '\n';
        puVar8[6] = '\x1a';
        puVar8[7] = '\n';
        puVar8[8] = '\0';
        puVar8[9] = '\0';
        puVar8[10] = '\0';
        puVar8[0xb] = '\r';
        puVar8[0xc] = 'I';
        puVar8[0xd] = 'H';
        puVar8[0xe] = 'D';
        puVar8[0xf] = 'R';
        puVar8[0x10] = (uchar)((uint)x >> 0x18);
        puVar8[0x11] = (uchar)((uint)x >> 0x10);
        puVar8[0x12] = (uchar)((uint)x >> 8);
        puVar8[0x13] = (uchar)x;
        puVar8[0x14] = (uchar)((uint)y >> 0x18);
        puVar8[0x15] = (uchar)((uint)y >> 0x10);
        puVar8[0x16] = (uchar)((uint)y >> 8);
        puVar8[0x17] = (uchar)y;
        puVar8[0x18] = '\b';
        puVar8[0x19] = (&DAT_00124130)[lVar9 * 4];
        puVar8[0x1a] = '\0';
        puVar8[0x1b] = '\0';
        local_38 = puVar8 + 0x1d;
        puVar8[0x1c] = '\0';
        stbiw__wpcrc(&local_38,0xd);
        puVar16 = local_38;
        *local_38 = (uchar)((uint)local_3c >> 0x18);
        local_38[1] = (uchar)((uint)local_3c >> 0x10);
        local_38[2] = (uchar)((uint)local_3c >> 8);
        local_38[3] = (uchar)local_3c;
        local_38[4] = 'I';
        local_38[5] = 'D';
        local_38[6] = 'A';
        local_38[7] = 'T';
        memmove(local_38 + 8,puVar23,sVar20);
        local_38 = puVar16 + sVar20 + 8;
        free(puVar23);
        stbiw__wpcrc(&local_38,local_3c);
        local_38[0] = '\0';
        local_38[1] = '\0';
        local_38[2] = '\0';
        local_38[3] = '\0';
        local_38[4] = 'I';
        local_38[5] = 'E';
        local_38[6] = 'N';
        local_38[7] = 'D';
        local_38 = local_38 + 8;
        stbiw__wpcrc(&local_38,0);
        if (local_38 == puVar8 + *out_len) {
          return puVar8;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/stb_image_write.h"
                      ,0x3da,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}